

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O0

int lzop_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  long local_30;
  ssize_t avail;
  uchar *p;
  archive_read_filter *filter_local;
  archive_read_filter_bidder *self_local;
  
  p = (uchar *)filter;
  filter_local = (archive_read_filter *)self;
  avail = (ssize_t)__archive_read_filter_ahead(filter,9,&local_30);
  if (((void *)avail == (void *)0x0) || (local_30 == 0)) {
    self_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp((void *)avail,anon_var_dwarf_139f4,9);
    if (iVar1 == 0) {
      self_local._4_4_ = 0x48;
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
lzop_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, LZOP_HEADER_MAGIC_LEN, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LZOP_HEADER_MAGIC, LZOP_HEADER_MAGIC_LEN))
		return (0);

	return (LZOP_HEADER_MAGIC_LEN * 8);
}